

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O3

void __thiscall level_mesh::validate_instances_order(level_mesh *this)

{
  pointer ppbVar1;
  pointer ppbVar2;
  uint32_t uVar3;
  
  ppbVar1 = (this->m_instances).
            super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppbVar2 = (this->m_instances).
            super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)ppbVar1 - (long)ppbVar2 >> 3 != (ulong)this->m_free_tag) {
    __assert_fail("m_free_tag == m_instances.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh.cxx"
                  ,0x8e,"void level_mesh::validate_instances_order()");
  }
  if (ppbVar2 != ppbVar1) {
    uVar3 = 0;
    do {
      if (uVar3 != (*ppbVar2)->tag) {
        __assert_fail("(*it)->tag == tag",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh.cxx"
                      ,0x91,"void level_mesh::validate_instances_order()");
      }
      ppbVar2 = ppbVar2 + 1;
      uVar3 = uVar3 + 1;
    } while (ppbVar2 != ppbVar1);
  }
  return;
}

Assistant:

void level_mesh::validate_instances_order()
{
	xr_assert(m_free_tag == m_instances.size());
	uint32_t tag = 0;
	for (b_model_instance_vec_it it = m_instances.begin(), end = m_instances.end(); it != end; ++it, ++tag)
		xr_assert((*it)->tag == tag);
}